

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::operator-=(BN *this,BN *bn)

{
  unsigned_short uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  puVar3 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar7 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar4 - (long)puVar7;
  if ((ulong)((long)puVar2 - (long)puVar3) < uVar6) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,(long)uVar6 >> 1)
    ;
    puVar7 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = (long)puVar4 - (long)puVar7;
  }
  if (puVar4 != puVar7) {
    uVar5 = (long)puVar2 - (long)puVar3;
    uVar8 = (long)uVar5 >> 1;
    uVar6 = ((long)uVar6 >> 1) + (ulong)((long)uVar6 >> 1 == 0);
    uVar11 = 0;
    uVar10 = 0;
    do {
      uVar9 = uVar8;
      if (uVar8 == uVar10) break;
      uVar11 = (uint)puVar3[uVar10] - (uVar11 + puVar7[uVar10]);
      puVar3[uVar10] = (unsigned_short)uVar11;
      uVar11 = uVar11 >> 0x1f;
      uVar10 = uVar10 + 1;
      uVar9 = uVar6;
    } while (uVar6 != uVar10);
    if (uVar11 != 0) {
      do {
        if (uVar8 <= uVar9) break;
        puVar7 = puVar3 + uVar9;
        uVar1 = *puVar7;
        *puVar7 = *puVar7 - 1;
        if (uVar1 != 0) {
          uVar11 = 0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar11 != 0);
      goto LAB_00108264;
    }
  }
  uVar5 = (long)puVar2 - (long)puVar3;
LAB_00108264:
  if (2 < uVar5) {
    uVar6 = (long)puVar2 - (long)puVar3;
    do {
      puVar2 = puVar2 + -1;
      if (*puVar2 != 0) {
        return this;
      }
      (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
      uVar6 = uVar6 - 2;
    } while (2 < uVar6);
  }
  return this;
}

Assistant:

BN& BN::operator -= (const BN& bn)
{
    if (ba.size() < bn.ba.size())
        ba.resize(bn.ba.size());

    bool flag = 0;
    size_t pos = 0;

    for (; pos < bn.ba.size() && pos < ba.size(); ++pos) {
        bt2s res = static_cast<bt2s>(ba[pos]) - bn.ba[pos] - flag;
        ba[pos] = static_cast<bt>(res);
        flag = (res < 0);
    }

    for (; flag && pos < ba.size(); ++pos) {
        if (ba[pos])
            flag = false;
        --ba[pos];
    }

    Norm(ba);
    return *this;
}